

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *p_work,
            number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *vec)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  type_conflict5 tVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<100U,_int,_void> local_d8;
  cpp_dec_float<100U,_int,_void> local_88;
  
  for (lVar5 = 0; lVar5 < this->thedim; lVar5 = lVar5 + 1) {
    iVar2 = (this->col).orig[lVar5];
    iVar3 = (this->row).orig[lVar5];
    local_d8.data._M_elems._0_8_ = *(undefined8 *)vec[iVar2].m_backend.data._M_elems;
    local_d8.data._M_elems._8_8_ = *(undefined8 *)(vec[iVar2].m_backend.data._M_elems + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 4;
    local_d8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 8;
    local_d8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._40_8_ = *(undefined8 *)(puVar1 + 2);
    puVar1 = vec[iVar2].m_backend.data._M_elems + 0xc;
    local_d8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
    local_d8.data._M_elems._56_8_ = *(undefined8 *)(puVar1 + 2);
    local_d8.exp = vec[iVar2].m_backend.exp;
    local_d8.neg = vec[iVar2].m_backend.neg;
    local_d8.fpclass = vec[iVar2].m_backend.fpclass;
    local_d8.prec_elem = vec[iVar2].m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)(vec + iVar2),0.0);
    local_88.data._M_elems[0] = 0;
    local_88.data._M_elems[1] = 0;
    tVar4 = boost::multiprecision::operator!=
                      ((number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_d8,(double *)&local_88);
    if (tVar4) {
      boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                (&local_d8,
                 &(this->diag).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend);
      *(undefined8 *)p_work[iVar3].m_backend.data._M_elems = local_d8.data._M_elems._0_8_;
      *(undefined8 *)(p_work[iVar3].m_backend.data._M_elems + 2) = local_d8.data._M_elems._8_8_;
      puVar1 = p_work[iVar3].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar1 = local_d8.data._M_elems._16_8_;
      *(undefined8 *)(puVar1 + 2) = local_d8.data._M_elems._24_8_;
      puVar1 = p_work[iVar3].m_backend.data._M_elems + 8;
      *(undefined8 *)puVar1 = local_d8.data._M_elems._32_8_;
      *(undefined8 *)(puVar1 + 2) = local_d8.data._M_elems._40_8_;
      puVar1 = p_work[iVar3].m_backend.data._M_elems + 0xc;
      *(undefined8 *)puVar1 = local_d8.data._M_elems._48_8_;
      *(undefined8 *)(puVar1 + 2) = local_d8.data._M_elems._56_8_;
      p_work[iVar3].m_backend.exp = local_d8.exp;
      p_work[iVar3].m_backend.neg = local_d8.neg;
      p_work[iVar3].m_backend.fpclass = local_d8.fpclass;
      p_work[iVar3].m_backend.prec_elem = local_d8.prec_elem;
      lVar6 = (long)(this->u).row.start[iVar3];
      lVar8 = (this->u).row.len[iVar3] + lVar6;
      lVar7 = lVar6 * 0x50;
      for (; lVar6 < lVar8; lVar6 = lVar6 + 1) {
        local_88.fpclass = cpp_dec_float_finite;
        local_88.prec_elem = 0x10;
        local_88.data._M_elems[0] = 0;
        local_88.data._M_elems[1] = 0;
        local_88.data._M_elems[2] = 0;
        local_88.data._M_elems[3] = 0;
        local_88.data._M_elems[4] = 0;
        local_88.data._M_elems[5] = 0;
        local_88.data._M_elems[6] = 0;
        local_88.data._M_elems[7] = 0;
        local_88.data._M_elems[8] = 0;
        local_88.data._M_elems[9] = 0;
        local_88.data._M_elems[10] = 0;
        local_88.data._M_elems[0xb] = 0;
        local_88.data._M_elems[0xc] = 0;
        local_88.data._M_elems[0xd] = 0;
        local_88.data._M_elems._56_5_ = 0;
        local_88.data._M_elems[0xf]._1_3_ = 0;
        local_88.exp = 0;
        local_88.neg = false;
        boost::multiprecision::default_ops::
        eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                  (&local_88,&local_d8,
                   (cpp_dec_float<100U,_int,_void> *)
                   ((long)(((this->u).row.val.
                            super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                            ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                   lVar7));
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator-=
                  (&vec[(this->u).row.idx[lVar6]].m_backend,&local_88);
        lVar7 = lVar7 + 0x50;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleft(R* p_work, R* vec)
{
   for(int i = 0; i < thedim; ++i)
   {
      int  c  = col.orig[i];
      int  r  = row.orig[i];

      assert(c >= 0);    // Inna/Tobi: otherwise, vec[c] would be strange...
      assert(r >= 0);    // Inna/Tobi: otherwise, diag[r] would be strange...

      R x  = vec[c];


      vec[c]  = 0.0;

      if(x != 0.0)
      {
         SOPLEX_DEBUG_CHECK_HUGE_VALUE("WSOLVE01", x);
         SOPLEX_DEBUG_CHECK_HUGE_VALUE("WSOLVE02", diag[r]);

         x        *= diag[r];
         p_work[r] = x;

         int end = u.row.start[r] + u.row.len[r];

         for(int m = u.row.start[r]; m < end; m++)
         {
            vec[u.row.idx[m]] -= x * u.row.val[m];
            SOPLEX_DEBUG_CHECK_HUGE_VALUE("WSOLVE03", vec[u.row.idx[m]]);
         }
      }
   }
}